

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O1

void __thiscall
coinscachepair_tests::linked_list_iterate_erase::test_method(linked_list_iterate_erase *this)

{
  long lVar1;
  _List_node_base *p_Var2;
  CoinsCachePair *pCVar3;
  CoinsCachePair *sentinel_00;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  CoinsCachePair *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  CoinsCachePair *local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  CoinsCachePair *node;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  nodes;
  CoinsCachePair **local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  CoinsCachePair ***local_100;
  CoinsCachePair **local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  CoinsCachePair ***local_d8;
  char *local_d0;
  char *local_c8;
  assertion_result local_c0;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  sentinel.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  sentinel.first.n = 0xffffffff;
  sentinel.second.m_prev = (CoinsCachePair *)0x0;
  sentinel.second.m_next = (CoinsCachePair *)0x0;
  sentinel.second.m_flags = '\0';
  sentinel.second._17_7_ = 0;
  sentinel.second.coin.out.nValue = 0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  sentinel.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  sentinel.second.coin._40_8_ = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&sentinel.second);
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_next = sentinel.second.m_prev;
  CreatePairs_abi_cxx11_(&nodes,(coinscachepair_tests *)sentinel.second.m_prev,sentinel_00);
  node = sentinel.second.m_next;
  if (nodes.
      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
    do {
      local_150 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_148 = "";
      local_160 = &boost::unit_test::basic_cstring<char_const>::null;
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x51;
      file.m_begin = (iterator)&local_150;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg)
      ;
      local_180.m_empty = false;
      local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
      local_170 = boost::unit_test::lazy_ostream::inst;
      local_168 = "";
      local_188 = (CoinsCachePair *)
                  (nodes.
                   super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next + 1);
      local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_188 == node);
      local_c0.m_message.px = (element_type *)0x0;
      local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
      ;
      local_c8 = "";
      local_f8 = &local_188;
      local_e8 = 0;
      local_f0 = &PTR__lazy_ostream_013d53c0;
      local_e0 = boost::unit_test::lazy_ostream::inst;
      local_d8 = &local_f8;
      local_120 = &node;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_013d53c0;
      local_108 = boost::unit_test::lazy_ostream::inst;
      local_100 = &local_120;
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_c0,&local_180,1,2,REQUIRE,0xe99931,(size_t)&local_d0,0x51,&local_f0,"node",
                 &local_118);
      boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
      node = (node->second).m_next;
      p_Var2 = (nodes.
                super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
      std::__cxx11::
      list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ::_M_erase(&nodes,(iterator)
                        nodes.
                        super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next);
      nodes.
      super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
    } while (p_Var2 != (_List_node_base *)&nodes);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x54;
  file_00.m_begin = (iterator)&local_198;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_120 = &local_188;
  local_188 = &sentinel;
  local_f8 = &node;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(node == local_188);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_d8 = &local_f8;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_110 = 0;
  local_100 = &local_120;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xff464e,(size_t)&local_d0,0x54,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x57;
  file_01.m_begin = (iterator)&local_1b8;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = sentinel.second.m_next;
  local_1d0 = &sentinel;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sentinel.second.m_next == local_1d0);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_188;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_120 = &local_1d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xe998ea,(size_t)&local_d0,0x57,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000058;
  file_02.m_begin = (iterator)&local_1e0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1f0,
             msg_02);
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_168 = "";
  local_188 = sentinel.second.m_prev;
  local_1d0 = &sentinel;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sentinel.second.m_prev == local_1d0);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_188;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013d53c0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013d53c0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  local_120 = &local_1d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_180,1,2,REQUIRE,0xe99863,(size_t)&local_d0,0x58,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::__cxx11::
  _List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_clear(&nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            );
  pCVar3 = sentinel.second.m_next;
  if (sentinel.second.m_flags != '\0') {
    ((sentinel.second.m_next)->second).m_prev = sentinel.second.m_prev;
    ((sentinel.second.m_prev)->second).m_next = pCVar3;
    sentinel.second._16_8_ = sentinel.second._16_8_ & 0xffffffffffffff00;
  }
  if (0x1c < sentinel.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_iterate_erase)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    auto nodes{CreatePairs(sentinel)};

    // Check iterating through pairs is identical to iterating through a list
    // Erase the nodes as we iterate through, but don't clear flags
    // The flags will be cleared by the CCoinsCacheEntry's destructor
    auto node{sentinel.second.Next()};
    for (auto expected{nodes.begin()}; expected != nodes.end(); expected = nodes.erase(expected)) {
        BOOST_CHECK_EQUAL(&(*expected), node);
        node = node->second.Next();
    }
    BOOST_CHECK_EQUAL(node, &sentinel);

    // Check that sentinel's next and prev are itself
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);
}